

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O0

uint32 __thiscall rw::Clump::streamGetSize(Clump *this)

{
  LLLink *pLVar1;
  uint32 uVar2;
  int iVar3;
  Frame *f;
  LLLink *pLVar4;
  Atomic *pAVar5;
  Light *this_00;
  Camera *this_01;
  LLLink *local_58;
  LLLink *lnk_3;
  LLLink *_next_3;
  LLLink *lnk_2;
  LLLink *_next_2;
  LLLink *lnk_1;
  LLLink *_next_1;
  LLLink *lnk;
  LLLink *_next;
  uint32 size;
  Clump *this_local;
  
  _next._4_4_ = 0x10;
  if (0x33000 < version) {
    _next._4_4_ = 0x18;
  }
  f = getFrame(this);
  uVar2 = FrameList_::streamGetSize(f);
  _next._4_4_ = uVar2 + _next._4_4_;
  if (0x303ff < version) {
    _next._4_4_ = _next._4_4_ + 0x1c;
    _next_1 = (this->atomics).link.next;
    while( true ) {
      pLVar1 = _next_1->next;
      pLVar4 = LinkList::end(&this->atomics);
      if (_next_1 == pLVar4) break;
      pAVar5 = Atomic::fromClump(_next_1);
      uVar2 = Geometry::streamGetSize(pAVar5->geometry);
      _next._4_4_ = uVar2 + 0xc + _next._4_4_;
      _next_1 = pLVar1;
    }
  }
  _next_2 = (this->atomics).link.next;
  while( true ) {
    pLVar1 = _next_2->next;
    pLVar4 = LinkList::end(&this->atomics);
    if (_next_2 == pLVar4) break;
    pAVar5 = Atomic::fromClump(_next_2);
    uVar2 = Atomic::streamGetSize(pAVar5);
    _next._4_4_ = uVar2 + 0xc + _next._4_4_;
    _next_2 = pLVar1;
  }
  _next_3 = (this->lights).link.next;
  while( true ) {
    pLVar1 = _next_3->next;
    pLVar4 = LinkList::end(&this->lights);
    if (_next_3 == pLVar4) break;
    this_00 = Light::fromClump(_next_3);
    uVar2 = Light::streamGetSize(this_00);
    _next._4_4_ = uVar2 + 0x1c + _next._4_4_;
    _next_3 = pLVar1;
  }
  local_58 = (this->cameras).link.next;
  while( true ) {
    pLVar1 = local_58->next;
    pLVar4 = LinkList::end(&this->cameras);
    if (local_58 == pLVar4) break;
    this_01 = Camera::fromClump(local_58);
    uVar2 = Camera::streamGetSize(this_01);
    _next._4_4_ = uVar2 + 0x1c + _next._4_4_;
    local_58 = pLVar1;
  }
  iVar3 = PluginList::streamGetSize((PluginList *)&s_plglist,this);
  return iVar3 + 0xc + _next._4_4_;
}

Assistant:

uint32
Clump::streamGetSize(void)
{
	uint32 size = 0;
	size += 12;	// Struct
	size += 4;	// numAtomics
	if(version > 0x33000)
		size += 8;	// numLights, numCameras

	// Frame list
	size += FrameList_::streamGetSize(this->getFrame());

	if(rw::version >= 0x30400){
		// Geometry list
		size += 12 + 12 + 4;
		FORLIST(lnk, this->atomics)
			size += 12 + Atomic::fromClump(lnk)->geometry->streamGetSize();
	}

	// Atomics
	FORLIST(lnk, this->atomics)
		size += 12 + Atomic::fromClump(lnk)->streamGetSize();

	// Lights
	FORLIST(lnk, this->lights)
		size += 16 + 12 + Light::fromClump(lnk)->streamGetSize();

	// Cameras
	FORLIST(lnk, this->cameras)
		size += 16 + 12 + Camera::fromClump(lnk)->streamGetSize();

	size += 12 + s_plglist.streamGetSize(this);
	return size;
}